

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O2

ssize_t __thiscall
cm::uv_async_ptr::send(uv_async_ptr *this,int __fd,void *__buf,size_t __n,int __flags)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  uv_handle_deleter<uv_async_s> *puVar2;
  undefined4 extraout_var;
  
  puVar2 = std::get_deleter<cm::uv_handle_deleter<uv_async_s>,uv_async_s>
                     ((shared_ptr<uv_async_s> *)this);
  if (puVar2 != (uv_handle_deleter<uv_async_s> *)0x0) {
    __mutex = (pthread_mutex_t *)
              (puVar2->handleMutex).super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    std::mutex::lock((mutex *)&__mutex->__data);
    if (*(uv_async_t **)this != (uv_async_t *)0x0) {
      uv_async_send(*(uv_async_t **)this);
    }
    iVar1 = pthread_mutex_unlock(__mutex);
    return CONCAT44(extraout_var,iVar1);
  }
  __assert_fail("deleter",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmUVHandlePtr.cxx"
                ,0x9f,"void cm::uv_async_ptr::send()");
}

Assistant:

void uv_async_ptr::send()
{
  auto* deleter =
    std::get_deleter<uv_handle_deleter<uv_async_t>>(this->handle);
  assert(deleter);

  std::lock_guard<std::mutex> lock(*deleter->handleMutex);
  if (this->handle) {
    uv_async_send(*this);
  }
}